

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int Rescale(uint8_t *src,int src_stride,int new_lines,WebPRescaler *wrk)

{
  int iVar1;
  int iVar2;
  int num_lines_out;
  int iVar3;
  
  iVar3 = 0;
  for (; 0 < new_lines; new_lines = new_lines - iVar1) {
    iVar1 = WebPRescalerImport(wrk,new_lines,src,src_stride);
    src = src + iVar1 * src_stride;
    iVar2 = WebPRescalerExport(wrk);
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

static int Rescale(const uint8_t* src, int src_stride,
                   int new_lines, WebPRescaler* const wrk) {
  int num_lines_out = 0;
  while (new_lines > 0) {    // import new contributions of source rows.
    const int lines_in = WebPRescalerImport(wrk, new_lines, src, src_stride);
    src += lines_in * src_stride;
    new_lines -= lines_in;
    num_lines_out += WebPRescalerExport(wrk);    // emit output row(s)
  }
  return num_lines_out;
}